

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  Node *pNVar2;
  TestCaseGroup *pTVar3;
  ArrayElement *pAVar4;
  bool extendedCases;
  TestCaseGroup *blockGroup_2;
  SharedPtr unsized;
  TestCaseGroup *blockGroup_1;
  SharedPtr sized;
  TestCaseGroup *blockGroup;
  bool namedNonArrayBlock;
  ProgramResourceQueryTestTarget queryTarget;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget = (ProgramResourceQueryTestTarget)targetGroup;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,
             PROGRAMINTERFACE_BUFFER_VARIABLE,4);
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::get(parentStructure);
  extendedCases = false;
  if (((ulong)pNVar2[1]._vptr_Node & 1) != 0) {
    pNVar2 = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::operator->(parentStructure);
    pNVar2 = ResourceDefinition::Node::getEnclosingNode(pNVar2);
    NVar1 = ResourceDefinition::Node::getType(pNVar2);
    extendedCases = NVar1 != TYPE_ARRAY_ELEMENT;
  }
  if (extendedCases) {
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar3,context,"non_array","Non-array target");
    tcu::TestNode::addChild((TestNode *)queryTarget,(TestNode *)pTVar3);
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1,false);
  }
  pAVar4 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&blockGroup_1,(Node *)pAVar4);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar3,context,"sized","Sized target");
  unsized.m_state = (SharedPtrStateBase *)pTVar3;
  tcu::TestNode::addChild((TestNode *)queryTarget,(TestNode *)pTVar3);
  generateBufferVariableArraySizeSubCases
            (context,(SharedPtr *)&blockGroup_1,(TestCaseGroup *)unsized.m_state,
             PROGRAMRESOURCEPROP_ARRAY_STRIDE,true,extendedCases);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&blockGroup_1);
  pAVar4 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar4,parentStructure,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&blockGroup_2,(Node *)pAVar4);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar3,context,"unsized","Unsized target");
  tcu::TestNode::addChild((TestNode *)queryTarget,(TestNode *)pTVar3);
  generateBufferVariableArraySizeSubCases
            (context,(SharedPtr *)&blockGroup_2,(TestCaseGroup *)pTVar3,
             PROGRAMRESOURCEPROP_ARRAY_STRIDE,false,extendedCases);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&blockGroup_2);
  return;
}

Assistant:

static void generateBufferVariableArrayCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp);
	const bool								namedNonArrayBlock	= static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named && parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	// .non_array
	if (namedNonArrayBlock)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "non_array", "Non-array target");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, 1, false);
	}

	// .sized
	{
		const ResourceDefinition::Node::SharedPtr	sized		(new ResourceDefinition::ArrayElement(parentStructure));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, sized, blockGroup, TargetProp, true, namedNonArrayBlock);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, unsized, blockGroup, TargetProp, false, namedNonArrayBlock);
	}
}